

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_string.hpp
# Opt level: O1

type jsoncons::detail::
     decode_base64_generic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,bool(*)(char),std::__cxx11::string>
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      last,uint8_t *reverse_alphabet,_func_bool_char *f,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result)

{
  undefined6 uVar1;
  undefined7 uVar2;
  bool bVar3;
  byte bVar4;
  undefined8 in_RAX;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  undefined8 uVar8;
  byte bVar9;
  uint uVar10;
  type tVar12;
  uint8_t a4 [4];
  uint8_t a3 [3];
  undefined8 uStack_38;
  ulong uVar11;
  
  uStack_38 = in_RAX;
  if (first._M_current == last._M_current) {
    uVar10 = 0;
  }
  else {
    uVar6 = 0;
    do {
      uVar10 = (uint)uVar6;
      if (*first._M_current == '=') break;
      bVar3 = (*f)(*first._M_current);
      uVar8 = uStack_38;
      if (!bVar3) {
        uVar8 = 1;
        goto LAB_002acafa;
      }
      bVar9 = (char)uVar6 + 1;
      uVar11 = (ulong)bVar9;
      *(char *)((long)&uStack_38 + uVar6 + 1) = *first._M_current;
      if (bVar9 == 4) {
        lVar5 = 0;
        do {
          *(uint8_t *)((long)&uStack_38 + lVar5 + 1) =
               reverse_alphabet[*(byte *)((long)&uStack_38 + lVar5 + 1)];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        bVar9 = uStack_38._2_1_;
        bVar4 = uStack_38._1_1_ << 2;
        bVar7 = uStack_38._2_1_ >> 4;
        uStack_38._0_6_ = CONCAT15(bVar7 & 3 | bVar4,(undefined5)uStack_38);
        uVar1 = (undefined6)uStack_38;
        uStack_38._3_1_ = SUB81(uVar8,3);
        bVar4 = uStack_38._3_1_;
        uStack_38._0_7_ = CONCAT16(uStack_38._3_1_ >> 2 & 0xf | bVar9 << 4,uVar1);
        uVar2 = (undefined7)uStack_38;
        uStack_38._4_1_ = SUB81(uVar8,4);
        uStack_38 = CONCAT17(bVar4 * '@' + uStack_38._4_1_,uVar2);
        lVar5 = 0;
        do {
          std::__cxx11::string::push_back((char)result);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        uVar11 = 0;
      }
      uVar10 = (uint)uVar11;
      first._M_current = first._M_current + 1;
      uVar6 = uVar11;
    } while (first._M_current != last._M_current);
  }
  uVar8 = uStack_38;
  first._M_current = last._M_current;
  if ((char)uVar10 == '\0') {
    uVar8 = 0;
  }
  else {
    uVar6 = 0;
    do {
      *(uint8_t *)((long)&uStack_38 + uVar6 + 1) =
           reverse_alphabet[*(byte *)((long)&uStack_38 + uVar6 + 1)];
      uVar6 = uVar6 + 1;
    } while (uVar10 != uVar6);
    bVar9 = uStack_38._2_1_;
    bVar4 = uStack_38._1_1_ << 2;
    bVar7 = uStack_38._2_1_ >> 4;
    uStack_38._0_6_ = CONCAT15(bVar7 & 3 | bVar4,(undefined5)uStack_38);
    uVar1 = (undefined6)uStack_38;
    uStack_38._3_1_ = SUB81(uVar8,3);
    uStack_38._7_1_ = SUB81(uVar8,7);
    uStack_38._0_7_ = CONCAT16(uStack_38._3_1_ >> 2 & 0xf | bVar9 << 4,uVar1);
    if (uVar10 != 1) {
      uVar6 = 0;
      do {
        std::__cxx11::string::push_back((char)result);
        uVar6 = uVar6 + 1;
      } while (uVar10 - 1 != uVar6);
    }
    uVar8 = 0;
  }
LAB_002acafa:
  tVar12._8_8_ = uVar8;
  tVar12.it._M_current = first._M_current;
  return tVar12;
}

Assistant:

typename std::enable_if<ext_traits::is_back_insertable_byte_container<Container>::value,decode_result<InputIt>>::type 
    decode_base64_generic(InputIt first, InputIt last, 
                          const uint8_t reverse_alphabet[256],
                          F f,
                          Container& result)
    {
        uint8_t a4[4], a3[3];
        uint8_t i = 0;
        uint8_t j = 0;

        while (first != last && *first != '=')
        {
            if (!f(*first))
            {
                return decode_result<InputIt>{first, conv_errc::conversion_failed};
            }

            a4[i++] = static_cast<uint8_t>(*first++); 
            if (i == 4)
            {
                for (i = 0; i < 4; ++i) 
                {
                    a4[i] = reverse_alphabet[a4[i]];
                }

                a3[0] = (a4[0] << 2) + ((a4[1] & 0x30) >> 4);
                a3[1] = ((a4[1] & 0xf) << 4) + ((a4[2] & 0x3c) >> 2);
                a3[2] = ((a4[2] & 0x3) << 6) +   a4[3];

                for (i = 0; i < 3; i++) 
                {
                    result.push_back(a3[i]);
                }
                i = 0;
            }
        }

        if (i > 0)
        {
            for (j = 0; j < i; ++j) 
            {
                a4[j] = reverse_alphabet[a4[j]];
            }

            a3[0] = (a4[0] << 2) + ((a4[1] & 0x30) >> 4);
            a3[1] = ((a4[1] & 0xf) << 4) + ((a4[2] & 0x3c) >> 2);

            for (j = 0; j < i - 1; ++j) 
            {
                result.push_back(a3[j]);
            }
        }
        return decode_result<InputIt>{last, conv_errc::success};
    }